

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstHelper.hpp
# Opt level: O0

FormulaList *
Kernel::SubstHelper::applyImpl<false,Indexing::CodeTreeSubstitution<Indexing::TermLiteralClause>>
          (FormulaList *fs,CodeTreeSubstitution<Indexing::TermLiteralClause> *applicator,
          bool noSharing)

{
  bool bVar1;
  List<Kernel::Formula_*> **ppLVar2;
  Formula *pFVar3;
  List<Kernel::Formula_*> *pLVar4;
  Formula *head;
  byte in_DL;
  List<Kernel::Formula_*> *in_RDI;
  bool in_stack_0000003f;
  CodeTreeSubstitution<Indexing::TermLiteralClause> *in_stack_00000040;
  Formula *in_stack_00000048;
  FormulaList *hs;
  Formula *h;
  FormulaList *gs;
  Formula *g;
  FormulaList *res;
  Stack<Lib::List<Kernel::Formula_*>_*> args;
  List<Kernel::Formula_*> *in_stack_ffffffffffffff38;
  Formula *in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  Stack<Lib::List<Kernel::Formula_*>_*> *in_stack_ffffffffffffff50;
  List<Kernel::Formula_*> *local_58;
  Stack<Lib::List<Kernel::Formula_*>_*> local_40;
  byte local_19;
  FormulaList *local_10;
  FormulaList *local_8;
  
  local_19 = in_DL & 1;
  local_10 = in_RDI;
  bVar1 = Lib::List<Kernel::Formula_*>::isEmpty(in_RDI);
  if (bVar1) {
    local_8 = local_10;
  }
  else {
    Lib::Stack<Lib::List<Kernel::Formula_*>_*>::Stack
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    while (bVar1 = Lib::List<Kernel::Formula_*>::isNonEmpty(local_10), bVar1) {
      Lib::Stack<Lib::List<Kernel::Formula_*>_*>::push
                ((Stack<Lib::List<Kernel::Formula_*>_*> *)in_stack_ffffffffffffff40,
                 in_stack_ffffffffffffff38);
      local_10 = Lib::List<Kernel::Formula_*>::tail(local_10);
    }
    ppLVar2 = Lib::Stack<Lib::List<Kernel::Formula_*>_*>::top(&local_40);
    local_58 = Lib::List<Kernel::Formula_*>::tail(*ppLVar2);
    while (bVar1 = Lib::Stack<Lib::List<Kernel::Formula_*>_*>::isNonEmpty(&local_40), bVar1) {
      local_10 = Lib::Stack<Lib::List<Kernel::Formula_*>_*>::pop(&local_40);
      pFVar3 = Lib::List<Kernel::Formula_*>::head(local_10);
      pLVar4 = Lib::List<Kernel::Formula_*>::tail(local_10);
      head = applyImpl<false,Indexing::CodeTreeSubstitution<Indexing::TermLiteralClause>>
                       (in_stack_00000048,in_stack_00000040,in_stack_0000003f);
      in_stack_ffffffffffffff40 = head;
      if ((pLVar4 == local_58) && (pFVar3 == head)) {
        local_58 = local_10;
      }
      else {
        pLVar4 = (List<Kernel::Formula_*> *)Lib::List<Kernel::Formula*>::operator_new(0x356460);
        Lib::List<Kernel::Formula_*>::List(pLVar4,head,local_58);
        local_58 = pLVar4;
      }
    }
    local_8 = local_58;
    Lib::Stack<Lib::List<Kernel::Formula_*>_*>::~Stack
              ((Stack<Lib::List<Kernel::Formula_*>_*> *)in_stack_ffffffffffffff40);
  }
  return local_8;
}

Assistant:

FormulaList* SubstHelper::applyImpl(FormulaList* fs, Applicator& applicator, bool noSharing)
{
  if (FormulaList::isEmpty(fs)) {
    return fs;
  }

  Stack<FormulaList*> args;
  while (FormulaList::isNonEmpty(fs)) {
    args.push(fs);
    fs = fs->tail();
  }

  FormulaList* res = args.top()->tail();
  ASS(FormulaList::isEmpty(res));

  while (args.isNonEmpty()) {
    fs = args.pop();
    Formula* g = fs->head();
    FormulaList* gs = fs->tail();
    Formula* h = applyImpl<ProcessSpecVars>(g, applicator, noSharing);
    FormulaList* hs = res; // = applyImpl<ProcessSpecVars>(gs, applicator, noSharing);

    if (gs == hs && g == h) {
      res = fs;
    } else {
      res = new FormulaList(h,hs);
    }
  }

  return res;
}